

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

Page * pager_alloc_page(Pager *pPager,pgno num_page)

{
  Page *pPVar1;
  uint uVar2;
  Page *pPVar3;
  Page *pPVar4;
  Page *pPVar5;
  
  pPVar1 = (Page *)SyMemBackendPoolAlloc(pPager->pAllocator,pPager->iPageSize + 0x68);
  if (pPVar1 != (Page *)0x0) {
    uVar2 = pPager->iPageSize + 0x68;
    if (uVar2 != 0) {
      pPVar3 = (Page *)((long)&pPVar1->zData + (ulong)uVar2);
      pPVar4 = pPVar1;
      do {
        *(undefined1 *)&pPVar4->zData = 0;
        pPVar5 = (Page *)((long)&pPVar4->zData + 1);
        if (pPVar3 <= pPVar5) break;
        *(undefined1 *)&pPVar5->zData = 0;
        pPVar5 = (Page *)((long)&pPVar4->zData + 2);
        if (pPVar3 <= pPVar5) break;
        *(undefined1 *)&pPVar5->zData = 0;
        pPVar5 = (Page *)((long)&pPVar4->zData + 3);
        if (pPVar3 <= pPVar5) break;
        *(undefined1 *)&pPVar5->zData = 0;
        pPVar4 = (Page *)((long)&pPVar4->zData + 4);
      } while (pPVar4 < pPVar3);
    }
    pPVar1->zData = (uchar *)(pPVar1 + 1);
    pPVar1->pPager = pPager;
    pPVar1->nRef = 1;
    pPVar1->pgno = num_page;
  }
  return pPVar1;
}

Assistant:

static Page * pager_alloc_page(Pager *pPager,pgno num_page)
{
	Page *pNew;
	
	pNew = (Page *)SyMemBackendPoolAlloc(pPager->pAllocator,sizeof(Page)+pPager->iPageSize);
	if( pNew == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pNew,sizeof(Page)+pPager->iPageSize);
	/* Page data */
	pNew->zData = (unsigned char *)&pNew[1];
	/* Fill in the structure */
	pNew->pPager = pPager;
	pNew->nRef = 1;
	pNew->pgno = num_page;
	return pNew;
}